

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O2

void __thiscall
prometheus::detail::MetricsHandler::RemoveCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  _Var4;
  long lVar5;
  const_iterator __first;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  __it;
  shared_ptr<prometheus::Collectable> locked;
  __shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *local_58;
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  *local_50;
  __shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->collectables_mutex_);
  std::__shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,collectable);
  local_50 = &this->collectables_;
  __it._M_current =
       (this->collectables_).
       super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = &((this->collectables_).
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  lVar3 = (long)p_Var1 - (long)__it._M_current;
  local_58 = &local_40;
  local_48 = &local_40;
  for (lVar5 = lVar3 >> 6; _Var4._M_current = __it._M_current, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it);
    if (bVar2) goto LAB_0012626e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0012626e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0012626e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0012626e;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x40;
  }
  lVar3 = lVar3 >> 4;
  if (lVar3 == 1) {
LAB_001262fe:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it);
    _Var4._M_current = __it._M_current;
    if (!bVar2) {
      _Var4._M_current = (weak_ptr<prometheus::Collectable> *)p_Var1;
    }
  }
  else if (lVar3 == 2) {
LAB_001262e3:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it);
    _Var4._M_current = __it._M_current;
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001262fe;
    }
  }
  else {
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var1;
    if (lVar3 != 3) goto LAB_001262ac;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_58,__it);
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_001262e3;
    }
  }
LAB_0012626e:
  __first._M_current = _Var4._M_current;
  if (&(_Var4._M_current)->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> !=
      p_Var1) {
    while (_Var4._M_current =
                (weak_ptr<prometheus::Collectable> *)
                (&(_Var4._M_current)->
                  super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1),
          (__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)_Var4._M_current !=
          p_Var1) {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_48,_Var4);
      if (!bVar2) {
        std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>,
                   (__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)
                   _Var4._M_current);
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
    }
  }
LAB_001262ac:
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::erase(local_50,__first,
          (this->collectables_).
          super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->collectables_mutex_);
  return;
}

Assistant:

void MetricsHandler::RemoveCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};

  auto locked = collectable.lock();
  auto same_pointer = [&locked](const std::weak_ptr<Collectable>& candidate) {
    return locked == candidate.lock();
  };

  collectables_.erase(std::remove_if(std::begin(collectables_),
                                     std::end(collectables_), same_pointer),
                      std::end(collectables_));
}